

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

int Tas_ManPropagate(Tas_Man_t *p,int Level)

{
  Tas_Que_t *p_00;
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t **ppGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Tas_Cls_t *pClause;
  Gia_Obj_t *pRes1;
  long lVar13;
  int *local_50;
  
  p_00 = &p->pClauses;
  do {
    lVar11 = (long)(p->pProp).iHead;
LAB_005bd1a1:
    iVar6 = (p->pProp).iTail;
    if ((lVar11 < iVar6) && (pGVar1 = (p->pProp).pData[lVar11], pGVar1 != (Gia_Obj_t *)0x0)) {
      if (((ulong)pGVar1 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x479,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
      }
      if ((pGVar1->field_0x3 & 0x40) == 0) {
        __assert_fail("Tas_VarIsAssigned(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x47a,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
      }
      s_Counter3 = s_Counter3 + 1;
      uVar5 = Tas_VarToLit(p,pGVar1);
      iVar6 = Abc_LitNot(uVar5);
      local_50 = p->pWatches + uVar5;
LAB_005bd20e:
      lVar12 = (long)*local_50;
      if (lVar12 != 0) {
        piVar2 = (p->pStore).pData;
        pClause = (Tas_Cls_t *)(piVar2 + lVar12);
        iVar7 = pClause[1].iNext[0];
        iVar8 = pClause[1].iNext[1];
        if (iVar7 == iVar6) {
          pClause[1].iNext[0] = iVar8;
          pClause[1].iNext[1] = iVar6;
          *(ulong *)pClause->iNext =
               CONCAT44((int)*(undefined8 *)pClause->iNext,
                        (int)((ulong)*(undefined8 *)pClause->iNext >> 0x20));
          iVar7 = iVar8;
        }
        else if (iVar8 != iVar6) {
          __assert_fail("pCur->pLits[1] == LitF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x42e,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
        }
        pGVar3 = p->pAig;
        iVar7 = Abc_Lit2Var(iVar7);
        pGVar9 = Gia_ManObj(pGVar3,iVar7);
        if (((pGVar9->field_0x3 & 0x40) == 0) ||
           (iVar7 = Tas_LitIsTrue(pGVar9,pClause[1].iNext[0]), iVar7 == 0)) break;
        goto LAB_005bd37e;
      }
      goto LAB_005bd43c;
    }
    (p->pProp).iHead = iVar6;
    iVar6 = (p->pJust).iHead;
    for (lVar11 = (long)iVar6; iVar7 = (p->pJust).iTail, lVar11 < iVar7; lVar11 = lVar11 + 1) {
      ppGVar4 = (p->pJust).pData;
      pGVar1 = ppGVar4[lVar11];
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      iVar7 = Tas_VarIsJust(pGVar1);
      if (iVar7 == 0) {
        s_Counter4 = s_Counter4 + 1;
        if (((ulong)pGVar1 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4be,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        uVar5 = (uint)*(undefined8 *)pGVar1;
        if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4bf,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        if ((uVar5 >> 0x1e & 1) == 0) {
          __assert_fail("Tas_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4c0,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        iVar7 = Tas_VarValue(pGVar1);
        if (iVar7 != 0) {
          __assert_fail("!Tas_VarValue(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4c1,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        iVar7 = Tas_VarFanin0Value(pGVar1);
        iVar8 = Tas_VarFanin1Value(pGVar1);
        if (iVar8 != 0 && iVar7 != 0) {
          if (iVar8 == 1 && iVar7 == 1) {
            iVar7 = Tas_ManAnalyze(p,Level,pGVar1,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff),
                                   pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff));
            if (iVar7 != 0) {
              return iVar7;
            }
          }
          else {
            if (iVar7 != 1 && iVar8 != 1) {
              __assert_fail("Value0 == 1 || Value1 == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                            ,0x4c9,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
            }
            if (iVar7 == 2) {
              uVar10 = *(ulong *)pGVar1;
              Tas_ManAssign(p,(Gia_Obj_t *)
                              (((ulong)((uint)(uVar10 >> 0x1d) & 1) |
                               (ulong)(pGVar1 + -(uVar10 & 0x1fffffff))) ^ 1),Level,pGVar1,
                            pGVar1 + -(uVar10 >> 0x20 & 0x1fffffff));
            }
            if (iVar8 == 2) {
              pGVar9 = Gia_ObjChild1(pGVar1);
              Tas_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar9 ^ 1),Level,pGVar1,
                            pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff));
            }
          }
        }
      }
      else {
        lVar12 = (long)iVar6;
        iVar6 = iVar6 + 1;
        ppGVar4[lVar12] = pGVar1;
      }
    }
    if (iVar6 == iVar7) {
      return 0;
    }
    (p->pJust).iTail = iVar6;
  } while( true );
  for (lVar13 = 2; iVar7 = pClause->nLits, lVar13 < iVar7; lVar13 = lVar13 + 1) {
    pGVar3 = p->pAig;
    iVar7 = Abc_Lit2Var(piVar2[lVar12 + lVar13 + 3]);
    pGVar9 = Gia_ManObj(pGVar3,iVar7);
    if (((pGVar9->field_0x3 & 0x40) == 0) ||
       (iVar7 = Tas_LitIsTrue(pGVar9,piVar2[lVar12 + lVar13 + 3]), iVar7 != 0)) {
      piVar2[lVar12 + 4] = pClause[1].iNext[lVar13];
      pClause[1].iNext[lVar13] = iVar6;
      *local_50 = piVar2[lVar12 + 1];
      Tas_ManWatchClause(p,pClause,piVar2[lVar12 + 4]);
      iVar7 = piVar2[lVar12 + 2];
      break;
    }
  }
  if ((int)lVar13 < iVar7) goto LAB_005bd20e;
  pGVar3 = p->pAig;
  iVar7 = Abc_Lit2Var(pClause[1].iNext[0]);
  pGVar9 = Gia_ManObj(pGVar3,iVar7);
  if ((pGVar9->field_0x3 & 0x40) == 0) {
    pGVar3 = p->pAig;
    iVar7 = pClause[1].iNext[0];
    iVar8 = Abc_Lit2Var(iVar7);
    pGVar9 = Gia_ManObj(pGVar3,iVar8);
    uVar5 = Abc_LitIsCompl(iVar7);
    Tas_ManAssign(p,(Gia_Obj_t *)((ulong)uVar5 ^ (ulong)pGVar9),Level,(Gia_Obj_t *)0x0,
                  (Gia_Obj_t *)pClause);
LAB_005bd37e:
    local_50 = pClause->iNext + 1;
    goto LAB_005bd20e;
  }
  iVar6 = Tas_LitIsTrue(pGVar9,pClause[1].iNext[0]);
  if (iVar6 != 0) {
    __assert_fail("!Tas_LitIsTrue( pObj, pCur->pLits[0] )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x463,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
  }
  if ((p->pClauses).iHead != (p->pClauses).iTail) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x402,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
  }
  Tas_QuePush(p_00,(Gia_Obj_t *)0x0);
  for (lVar13 = 0; lVar13 < pClause->nLits; lVar13 = lVar13 + 1) {
    pGVar3 = p->pAig;
    iVar6 = Abc_Lit2Var(piVar2[lVar12 + lVar13 + 3]);
    pGVar9 = Gia_ManObj(pGVar3,iVar6);
    if ((pGVar9->field_0x3 & 0x40) == 0) {
      __assert_fail("Tas_VarIsAssigned(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x407,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
    }
    iVar6 = Tas_LitIsTrue(pGVar9,piVar2[lVar12 + lVar13 + 3]);
    if (iVar6 != 0) {
      __assert_fail("!Tas_LitIsTrue( pObj, pCls->pLits[i] )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x408,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
    }
    Tas_QuePush(p_00,pGVar9);
  }
  Tas_ManDeriveReason(p,Level);
  iVar6 = Tas_QueFinish(p_00);
  if (iVar6 != 0) {
    return iVar6;
  }
LAB_005bd43c:
  uVar5 = (uint)*(undefined8 *)pGVar1;
  if ((~uVar5 & 0x9fffffff) == 0) goto LAB_005bd64a;
  if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x488,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
  }
  iVar6 = Tas_VarFanin0Value(pGVar1);
  iVar7 = Tas_VarFanin1Value(pGVar1);
  iVar8 = Tas_VarValue(pGVar1);
  if (iVar8 == 0) {
    if (iVar7 == 0 || iVar6 == 0) goto LAB_005bd64a;
    if (iVar7 != 1 || iVar6 != 1) {
      if (iVar6 != 1 && iVar7 != 1) {
        iVar6 = Tas_VarIsJust(pGVar1);
        if (iVar6 == 0) {
          __assert_fail("Tas_VarIsJust(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x4a9,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        lVar12 = (long)(p->pJust).iHead;
        while ((lVar12 < (p->pJust).iTail &&
               (pGVar9 = (p->pJust).pData[lVar12], pGVar9 != (Gia_Obj_t *)0x0))) {
          lVar12 = lVar12 + 1;
          if (pGVar9 == pGVar1) {
            __assert_fail("!Tas_QueHasNode( &p->pJust, pVar )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4aa,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
          }
        }
        Tas_QuePush(&p->pJust,pGVar1);
        goto LAB_005bd64a;
      }
      if (iVar6 == 2) {
        uVar10 = *(ulong *)pGVar1;
        Tas_ManAssign(p,(Gia_Obj_t *)
                        (((ulong)((uint)(uVar10 >> 0x1d) & 1) |
                         (ulong)(pGVar1 + -(uVar10 & 0x1fffffff))) ^ 1),Level,pGVar1,
                      pGVar1 + -(uVar10 >> 0x20 & 0x1fffffff));
      }
      if (iVar7 != 2) goto LAB_005bd64a;
      pGVar9 = Gia_ObjChild1(pGVar1);
      pGVar9 = (Gia_Obj_t *)((ulong)pGVar9 ^ 1);
      pRes1 = pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      goto LAB_005bd5c9;
    }
LAB_005bd60b:
    uVar10 = *(ulong *)pGVar1 & 0x1fffffff;
    pGVar9 = pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff);
  }
  else {
    if (iVar7 != 0 && iVar6 != 0) {
      if (iVar6 == 2) {
        Tas_ManAssign(p,(Gia_Obj_t *)
                        ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) |
                        (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff))),Level,
                      pGVar1,(Gia_Obj_t *)0x0);
      }
      if (iVar7 != 2) goto LAB_005bd64a;
      pGVar9 = Gia_ObjChild1(pGVar1);
      pRes1 = (Gia_Obj_t *)0x0;
LAB_005bd5c9:
      Tas_ManAssign(p,pGVar9,Level,pGVar1,pRes1);
      goto LAB_005bd64a;
    }
    if (iVar7 == 0 || iVar6 != 0) {
      if (iVar6 == 0 || iVar7 != 0) {
        if (iVar6 != 0 || iVar7 != 0) {
          __assert_fail("Value0 == 0 && Value1 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x493,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        goto LAB_005bd60b;
      }
      uVar5 = *(uint *)&pGVar1->field_0x4;
    }
    else {
      uVar5 = (uint)*(undefined8 *)pGVar1;
    }
    uVar10 = (ulong)(uVar5 & 0x1fffffff);
    pGVar9 = (Gia_Obj_t *)0x0;
  }
  iVar6 = Tas_ManAnalyze(p,Level,pGVar1,pGVar1 + -uVar10,pGVar9);
  if (iVar6 != 0) {
    return iVar6;
  }
LAB_005bd64a:
  lVar11 = lVar11 + 1;
  goto LAB_005bd1a1;
}

Assistant:

int Tas_ManPropagate( Tas_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;//, nIter = 0;
    while ( 1 )
    {
//        nIter++;
        Tas_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Tas_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Tas_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Tas_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Tas_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
//    printf( "%d ", nIter );
    return 0;
}